

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall Assimp::FBX::FBXConverter::~FBXConverter(FBXConverter *this)

{
  std::
  for_each<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,Assimp::FBX::Util::delete_fun<aiMesh>>
            ((this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,Assimp::FBX::Util::delete_fun<aiMaterial>>
            ((this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiAnimation**,std::vector<aiAnimation*,std::allocator<aiAnimation*>>>,Assimp::FBX::Util::delete_fun<aiAnimation>>
            ((this->animations).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->animations).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiLight**,std::vector<aiLight*,std::allocator<aiLight*>>>,Assimp::FBX::Util::delete_fun<aiLight>>
            ((this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiCamera**,std::vector<aiCamera*,std::allocator<aiCamera*>>>,Assimp::FBX::Util::delete_fun<aiCamera>>
            ((this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiTexture**,std::vector<aiTexture*,std::allocator<aiTexture*>>>,Assimp::FBX::Util::delete_fun<aiTexture>>
            ((this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
  ::~_Rb_tree(&(this->bone_map)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->mNodeNames)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->node_anim_chain_bits)._M_t);
  std::
  _Rb_tree<const_Assimp::FBX::Geometry_*,_std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&(this->meshes_converted)._M_t);
  std::
  _Rb_tree<const_Assimp::FBX::Video,_std::pair<const_Assimp::FBX::Video,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>,_std::less<const_Assimp::FBX::Video>,_std::allocator<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->textures_converted)._M_t);
  std::
  _Rb_tree<const_Assimp::FBX::Material_*,_std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->materials_converted)._M_t);
  std::_Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>::~_Vector_base
            (&(this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>);
  std::_Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>::~_Vector_base
            (&(this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>);
  std::_Vector_base<aiLight_*,_std::allocator<aiLight_*>_>::~_Vector_base
            (&(this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>);
  std::_Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>::~_Vector_base
            (&(this->animations).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>);
  std::_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~_Vector_base
            (&(this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>);
  std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
            (&(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  return;
}

Assistant:

FBXConverter::~FBXConverter() {
            std::for_each(meshes.begin(), meshes.end(), Util::delete_fun<aiMesh>());
            std::for_each(materials.begin(), materials.end(), Util::delete_fun<aiMaterial>());
            std::for_each(animations.begin(), animations.end(), Util::delete_fun<aiAnimation>());
            std::for_each(lights.begin(), lights.end(), Util::delete_fun<aiLight>());
            std::for_each(cameras.begin(), cameras.end(), Util::delete_fun<aiCamera>());
            std::for_each(textures.begin(), textures.end(), Util::delete_fun<aiTexture>());
        }